

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

void bitset_inplace_difference(bitset_t *b1,bitset_t *b2)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = b2->arraysize;
  if (b1->arraysize < b2->arraysize) {
    uVar1 = b1->arraysize;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    b1->array[uVar2] = b1->array[uVar2] & ~b2->array[uVar2];
  }
  return;
}

Assistant:

void bitset_inplace_difference(bitset_t *CBITSET_RESTRICT b1,
                               const bitset_t *CBITSET_RESTRICT b2) {
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    size_t k = 0;
    for (; k < minlength; ++k) {
        b1->array[k] &= ~(b2->array[k]);
    }
}